

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O2

sunrealtype IDASensWrmsNorm(IDAMem IDA_mem,N_Vector *xS,N_Vector *wS,int mask)

{
  double dVar1;
  long lVar2;
  sunrealtype sVar3;
  
  if (mask == 0) {
    N_VWrmsNormVectorArray(IDA_mem->ida_Ns,xS,wS,IDA_mem->ida_cvals);
  }
  else {
    N_VWrmsNormMaskVectorArray();
  }
  sVar3 = *IDA_mem->ida_cvals;
  for (lVar2 = 1; lVar2 < IDA_mem->ida_Ns; lVar2 = lVar2 + 1) {
    dVar1 = IDA_mem->ida_cvals[lVar2];
    if (dVar1 <= sVar3) {
      dVar1 = sVar3;
    }
    sVar3 = dVar1;
  }
  return sVar3;
}

Assistant:

sunrealtype IDASensWrmsNorm(IDAMem IDA_mem, N_Vector* xS, N_Vector* wS,
                            sunbooleantype mask)
{
  int is;
  sunrealtype nrm;

  if (mask)
  {
    (void)N_VWrmsNormMaskVectorArray(IDA_mem->ida_Ns, xS, wS, IDA_mem->ida_id,
                                     IDA_mem->ida_cvals);
  }
  else
  {
    (void)N_VWrmsNormVectorArray(IDA_mem->ida_Ns, xS, wS, IDA_mem->ida_cvals);
  }

  nrm = IDA_mem->ida_cvals[0];
  for (is = 1; is < IDA_mem->ida_Ns; is++)
  {
    if (IDA_mem->ida_cvals[is] > nrm) { nrm = IDA_mem->ida_cvals[is]; }
  }

  return (nrm);
}